

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O1

char * duckdb_get_varchar(duckdb_value value)

{
  size_t __n;
  string *psVar1;
  char *__dest;
  Value str_val;
  LogicalType local_70;
  Value local_58;
  
  duckdb::LogicalType::LogicalType(&local_70,VARCHAR);
  duckdb::Value::DefaultCastAs(&local_58,(Value *)value,&local_70,false);
  duckdb::LogicalType::~LogicalType(&local_70);
  psVar1 = duckdb::StringValue::Get_abi_cxx11_(&local_58);
  __n = psVar1->_M_string_length;
  __dest = (char *)malloc(__n + 1);
  switchD_012e1ce8::default(__dest,(psVar1->_M_dataplus)._M_p,__n);
  __dest[__n] = '\0';
  duckdb::Value::~Value(&local_58);
  return __dest;
}

Assistant:

char *duckdb_get_varchar(duckdb_value value) {
	auto val = reinterpret_cast<duckdb::Value *>(value);
	auto str_val = val->DefaultCastAs(duckdb::LogicalType::VARCHAR);
	auto &str = duckdb::StringValue::Get(str_val);

	auto result = reinterpret_cast<char *>(malloc(sizeof(char) * (str.size() + 1)));
	memcpy(result, str.c_str(), str.size());
	result[str.size()] = '\0';
	return result;
}